

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

bool __thiscall
ON_3dmUnitsAndTolerances::Read(ON_3dmUnitsAndTolerances *this,ON_BinaryArchive *file)

{
  bool bVar1;
  LengthUnitSystem us;
  bool bVar2;
  OBSOLETE_DistanceDisplayMode OVar3;
  wchar_t *custom_unit_name_00;
  int version;
  uint dm;
  ON_wString custom_unit_name;
  int i;
  double meters_per_unit;
  ON__INT32 local_40;
  ON__UINT32 local_3c;
  ON_wString local_38;
  uint local_2c;
  double local_28;
  
  operator=(this,&Millimeters);
  local_40 = 0;
  bVar1 = ON_BinaryArchive::ReadInt(file,&local_40);
  if (!bVar1) {
    return bVar1;
  }
  if (local_40 - 100U < 100) {
    local_28 = 1.0;
    ON_wString::ON_wString(&local_38);
    local_2c = 0xffffffff;
    bVar1 = ON_BinaryArchive::ReadInt(file,(ON__INT32 *)&local_2c);
    us = None;
    bVar2 = false;
    if (bVar1) {
      us = ON::LengthUnitSystemFromUnsigned(local_2c);
      bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_absolute_tolerance);
      if ((bVar1) && (bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_angle_tolerance), bVar1)) {
        bVar2 = ON_BinaryArchive::ReadDouble(file,&this->m_relative_tolerance);
      }
      else {
        bVar2 = false;
      }
    }
    if (100 < local_40) {
      local_3c = 0;
      if ((bVar2 == false) || (bVar1 = ON_BinaryArchive::ReadInt(file,&local_3c), !bVar1)) {
        bVar2 = false;
      }
      else {
        OVar3 = ON::DistanceDisplayModeFromUnsigned(local_3c);
        this->m_distance_display_mode = OVar3;
        bVar2 = ON_BinaryArchive::ReadInt(file,&this->m_distance_display_precision);
      }
      if (0x14 < (uint)this->m_distance_display_precision) {
        this->m_distance_display_precision = 3;
      }
      if ((0x65 < local_40 & bVar2) == 1) {
        bVar1 = ON_BinaryArchive::ReadDouble(file,&local_28);
        if (bVar1) {
          bVar2 = ON_BinaryArchive::ReadString(file,&local_38);
        }
        else {
          bVar2 = false;
        }
      }
      else {
        bVar2 = (bool)(bVar2 & local_40 < 0x66);
      }
    }
    if (us == CustomUnits) {
      custom_unit_name_00 = ON_wString::operator_cast_to_wchar_t_(&local_38);
      ON_UnitSystem::SetCustomUnitSystem(&this->m_unit_system,custom_unit_name_00,local_28);
    }
    else {
      ON_UnitSystem::SetUnitSystem(&this->m_unit_system,us);
    }
    ON_wString::~ON_wString(&local_38);
    return bVar2;
  }
  return bVar1;
}

Assistant:

bool ON_3dmUnitsAndTolerances::Read( ON_BinaryArchive& file )
{
  *this = ON_3dmUnitsAndTolerances::Millimeters;
  int version = 0;
  bool rc = file.ReadInt( &version );
  if ( rc && version >= 100 && version < 200 )
  {
    ON::LengthUnitSystem us = ON::LengthUnitSystem::None;
    double meters_per_unit = 1.0;
    ON_wString custom_unit_name;

    int i = ON_UNSET_UINT_INDEX;
    rc = file.ReadInt( &i );
    if ( rc )
      us = ON::LengthUnitSystemFromUnsigned(i);
    if ( rc ) rc = file.ReadDouble( &m_absolute_tolerance );
    if ( rc ) rc = file.ReadDouble( &m_angle_tolerance );
    if ( rc ) rc = file.ReadDouble( &m_relative_tolerance );
    if ( version >= 101 ) 
    {
      unsigned int dm = static_cast<unsigned int>(ON::OBSOLETE_DistanceDisplayMode::Decimal);
      if ( rc ) rc = file.ReadInt( &dm );
      if ( rc ) m_distance_display_mode = ON::DistanceDisplayModeFromUnsigned(dm);
      if ( rc ) rc = file.ReadInt( &m_distance_display_precision );
      if ( m_distance_display_precision < 0 || m_distance_display_precision > 20 )
        m_distance_display_precision = 3; // some beta files had bogus values stored in file
      if ( version >= 102 ) 
      {
        if ( rc ) rc = file.ReadDouble( &meters_per_unit );
        if ( rc ) rc = file.ReadString( custom_unit_name );
      }
    }
    if ( ON::LengthUnitSystem::CustomUnits == us )
      m_unit_system.SetCustomUnitSystem(custom_unit_name,meters_per_unit);
    else
      m_unit_system.SetUnitSystem(us);
  }
  return rc;
}